

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_file(FILE *f,lyd_node *root,LYD_FORMAT format,int options)

{
  LY_ERR *pLVar1;
  undefined1 local_48 [8];
  lyout out;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  FILE *f_local;
  
  out.method.mem.size._0_4_ = options;
  out.method.mem.size._4_4_ = format;
  if (f == (FILE *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    f_local._4_4_ = 1;
  }
  else {
    local_48._0_4_ = LYOUT_STREAM;
    out._0_8_ = f;
    f_local._4_4_ = lyd_print_((lyout *)local_48,root,format,options);
  }
  return f_local._4_4_;
}

Assistant:

API int
lyd_print_file(FILE *f, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    struct lyout out;

    if (!f) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    out.type = LYOUT_STREAM;
    out.method.f = f;

    return lyd_print_(&out, root, format, options);
}